

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O0

void __thiscall soul::ASTVisitor::visit(ASTVisitor *this,VariableDeclaration *v)

{
  VariableDeclaration *v_local;
  ASTVisitor *this_local;
  
  visitObjectIfNotNull<soul::pool_ptr<soul::AST::Expression>>(this,&v->declaredType);
  visitObjectIfNotNull<soul::pool_ptr<soul::AST::Expression>>(this,&v->initialValue);
  (*this->_vptr_ASTVisitor[0xb])(this,&v->annotation);
  return;
}

Assistant:

virtual void visit (AST::VariableDeclaration& v)
    {
        visitObjectIfNotNull (v.declaredType);
        visitObjectIfNotNull (v.initialValue);
        visit (v.annotation);
    }